

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::xoshiro256plus_&,_const_trng::xoshiro256plus_&> * __thiscall
Catch::ExprLhs<trng::xoshiro256plus_const&>::operator==
          (BinaryExpr<const_trng::xoshiro256plus_&,_const_trng::xoshiro256plus_&>
           *__return_storage_ptr__,ExprLhs<trng::xoshiro256plus_const&> *this,xoshiro256plus *rhs)

{
  xoshiro256plus *pxVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = trng::operator==(*(xoshiro256plus **)this,rhs);
  pxVar1 = *(xoshiro256plus **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002ea210;
  __return_storage_ptr__->m_lhs = pxVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }